

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::Recycle
          (VulkanSyncObjectManager *this,VkFenceType vkFence,bool IsUnsignaled)

{
  PFN_vkResetFences p_Var1;
  VkDevice pVVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> Lock;
  bool IsUnsignaled_local;
  VulkanSyncObjectManager *this_local;
  VkFenceType vkFence_local;
  
  p_Var1 = vkResetFences;
  Lock._M_device._7_1_ = IsUnsignaled;
  this_local = (VulkanSyncObjectManager *)vkFence.Value;
  if (!IsUnsignaled) {
    pVVar2 = VulkanLogicalDevice::GetVkDevice(this->m_LogicalDevice);
    (*p_Var1)(pVVar2,1,(VkFence *)&this_local);
  }
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_FencePoolGuard);
  std::vector<VkFence_T_*,_std::allocator<VkFence_T_*>_>::push_back
            (&this->m_FencePool,(value_type *)&this_local);
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void VulkanSyncObjectManager::Recycle(VkFenceType vkFence, bool IsUnsignaled)
{
    if (!IsUnsignaled)
    {
        // Access to vkFence must be externally synchronized, we assume that vkFence is not used anywhere else.
        vkResetFences(m_LogicalDevice.GetVkDevice(), 1, &vkFence.Value);
    }

    std::lock_guard<std::mutex> Lock{m_FencePoolGuard};
    m_FencePool.push_back(vkFence.Value);
}